

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

double hdr_mean(hdr_histogram *h)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  hdr_iter iter;
  hdr_histogram *local_b0;
  undefined4 local_a8;
  long local_a0;
  long local_98;
  undefined8 uStack_90;
  int64_t local_88;
  undefined8 uStack_80;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_38;
  
  lVar1 = h->total_count;
  local_a8 = 0xffffffff;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = all_values_iter_next;
  lVar5 = 0;
  lVar6 = 0;
  local_b0 = h;
  local_a0 = lVar1;
  while ((cVar3 = (*local_38)(&local_b0), lVar2 = local_98, cVar3 != '\0' && (lVar5 < lVar1))) {
    if (local_98 != 0) {
      lVar5 = lVar5 + local_98;
      iVar4 = hdr_median_equivalent_value(h,local_88);
      lVar6 = lVar6 + iVar4 * lVar2;
    }
  }
  return (double)lVar6 / (double)lVar1;
}

Assistant:

double hdr_mean(const struct hdr_histogram* h)
{
    struct hdr_iter iter;
    int64_t total = 0, count = 0;
    int64_t total_count = h->total_count;

    hdr_iter_init(&iter, h);

    while (hdr_iter_next(&iter) && count < total_count)
    {
        if (0 != iter.count)
        {
            count += iter.count;
            total += iter.count * hdr_median_equivalent_value(h, iter.value);
        }
    }

    return (total * 1.0) / total_count;
}